

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 soft_f32_div(float32 a,float32 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  FloatParts FVar11;
  FloatParts FVar12;
  FloatParts p;
  FloatParts b_00;
  
  FVar11._8_8_ = (ulong)(a >> 0x17 & 0xff) | (ulong)(a & 0x80000000) << 9;
  FVar11.frac = (ulong)(a & 0x7fffff);
  FVar11 = sf_canonicalize(FVar11,&float32_params,status);
  uVar9 = FVar11._8_8_;
  uVar8 = FVar11.frac;
  FVar12._8_8_ = (ulong)(b >> 0x17 & 0xff) | (ulong)(b & 0x80000000) << 9;
  FVar12.frac = (ulong)(b & 0x7fffff);
  FVar12 = sf_canonicalize(FVar12,&float32_params,status);
  uVar4 = FVar12._8_8_;
  uVar10 = FVar12.frac;
  uVar7 = (uVar4 ^ uVar9) & 0x10000000000;
  uVar5 = FVar11._12_4_ & 0xff;
  uVar3 = FVar12._12_4_ & 0xff;
  if ((uVar5 == 2) && (uVar3 == 2)) {
    uVar4 = (ulong)((FVar11.exp - FVar12.exp) - (uint)(uVar8 < uVar10));
    lVar6 = 0;
    if (uVar10 <= uVar8) {
      lVar6 = uVar8 << 0x3f;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10 * 2;
    auVar2._8_8_ = uVar8 >> (uVar10 <= uVar8);
    auVar2._0_8_ = lVar6;
    uVar8 = (ulong)(SUB168(auVar2 % auVar1,0) != 0) | SUB168(auVar2 / auVar1,0);
    uVar9 = uVar9 & 0xffff00ff00000000;
  }
  else {
    if (((uVar9 | uVar4) & 0xfc00000000) != 0) {
      b_00._8_8_ = uVar4 & 0xffffffffffff;
      b_00.frac = uVar10;
      p = pick_nan(FVar11,b_00,status);
      goto LAB_00cfc09a;
    }
    if (((uVar9 >> 0x20 & 1) != 0) && (uVar5 == uVar3)) {
      status->float_exception_flags = status->float_exception_flags | 1;
      p.exp = 0x7fffffff;
      p.cls = float_class_qnan;
      p.sign = false;
      p._14_2_ = 0;
      p.frac = 0x2000000000000000;
      goto LAB_00cfc09a;
    }
    if ((uVar9 >> 0x20 & 1) != 0) {
      uVar7 = uVar7 | uVar9 & 0xffff0003ffffffff;
      p.exp = (int)uVar7;
      p.cls = (char)(uVar7 >> 0x20);
      p.sign = (_Bool)(char)(uVar7 >> 0x28);
      p._14_2_ = (short)(uVar7 >> 0x30);
      p.frac = uVar8;
      goto LAB_00cfc09a;
    }
    if (uVar3 == 3) {
      uVar10 = uVar9 & 0xffff0000ffffffff | uVar7 | 0x100000000;
      p.exp = (int)uVar10;
      p.cls = (char)(uVar10 >> 0x20);
      p.sign = (_Bool)(char)(uVar10 >> 0x28);
      p._14_2_ = (short)(uVar10 >> 0x30);
      p.frac = uVar8;
      goto LAB_00cfc09a;
    }
    if (uVar3 != 1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    status->float_exception_flags = status->float_exception_flags | 4;
    uVar9 = uVar9 & 0xffff0000ffffffff;
    uVar4 = 0x300000000;
  }
  uVar7 = uVar4 | uVar9 | uVar7;
  p.exp = (int)uVar7;
  p.cls = (char)(uVar7 >> 0x20);
  p.sign = (_Bool)(char)(uVar7 >> 0x28);
  p._14_2_ = (short)(uVar7 >> 0x30);
  p.frac = uVar8;
LAB_00cfc09a:
  FVar11 = round_canonical(p,status,&float32_params);
  return (uint)FVar11.frac & 0x7fffff | (FVar11.exp & 0xffU) << 0x17 |
         (uint)(FVar11._8_8_ >> 9) & 0x80000000;
}

Assistant:

static float32 QEMU_SOFTFLOAT_ATTR
soft_f32_div(float32 a, float32 b, float_status *status)
{
    FloatParts pa = float32_unpack_canonical(a, status);
    FloatParts pb = float32_unpack_canonical(b, status);
    FloatParts pr = div_floats(pa, pb, status);

    return float32_round_pack_canonical(pr, status);
}